

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O3

uint32_t MurmurHash2A(void *key,int len,uint32_t seed)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t h;
  uint32_t l;
  
  uVar3 = len;
  uVar4 = len;
  if (3 < len) {
    do {
      iVar1 = *key;
      key = (void *)((long)key + 4);
      seed = seed * 0x5bd1e995 ^
             ((uint)(iVar1 * 0x5bd1e995) >> 0x18 ^ iVar1 * 0x5bd1e995) * 0x5bd1e995;
      uVar4 = uVar3 - 4;
      bVar2 = 7 < uVar3;
      uVar3 = uVar4;
    } while (bVar2);
  }
  uVar3 = 0;
  if (uVar4 != 1) {
    if (uVar4 != 2) {
      if (uVar4 != 3) goto LAB_00164812;
      uVar3 = (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar3 = uVar3 | (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar3 = (*key ^ uVar3) * 0x5bd1e995;
LAB_00164812:
  uVar4 = (seed * 0x5bd1e995 ^ (uVar3 >> 0x18 ^ uVar3) * 0x5bd1e995) * 0x5bd1e995 ^
          ((uint)(len * 0x5bd1e995) >> 0x18 ^ len * 0x5bd1e995) * 0x5bd1e995;
  uVar4 = (uVar4 >> 0xd ^ uVar4) * 0x5bd1e995;
  return uVar4 >> 0xf ^ uVar4;
}

Assistant:

uint32_t MurmurHash2A ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;
  uint32_t l = len;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    mmix(h,k);

    data += 4;
    len -= 4;
  }

  uint32_t t = 0;

  switch(len)
  {
  case 3: t ^= data[2] << 16;
  case 2: t ^= data[1] << 8;
  case 1: t ^= data[0];
  };

  mmix(h,t);
  mmix(h,l);

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}